

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O3

void __thiscall
Clasp::Asp::PrgDepGraph::addSccs
          (PrgDepGraph *this,LogicProgram *prg,AtomList *sccAtoms,NonHcfSet *nonHcfs)

{
  pointer pLVar1;
  PrgAtom *pPVar2;
  PrgNode PVar3;
  pointer pAVar4;
  pointer pPVar5;
  PrgBody *pPVar6;
  pointer pBVar7;
  pointer ppNVar8;
  pointer puVar9;
  PrgDepGraph *pPVar10;
  NonHcfSet *pNVar11;
  uint32 uVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NonHcfStats *pNVar14;
  uint uVar15;
  SharedContext *pSVar16;
  long lVar17;
  uint *puVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  pointer pLVar23;
  LogicProgram *pLVar24;
  bool bVar25;
  NodeId bId;
  VarVec adj;
  VarVec ext;
  Memcpy<unsigned_int> local_a8;
  PrgDepGraph *local_a0;
  LogicProgram *local_98;
  SharedContext *local_90;
  AtomList *local_88;
  BodyVec *local_80;
  AtomNode local_78;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ulong local_48;
  uint32 local_40;
  uint local_3c;
  NonHcfSet *local_38;
  
  local_38 = nonHcfs;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  ::reserve(&this->atoms_,(sccAtoms->ebo_).size + (this->atoms_).ebo_.size);
  pSVar16 = (prg->super_ProgramBuilder).ctx_;
  uVar20 = (ulong)(sccAtoms->ebo_).size;
  local_a0 = this;
  local_98 = prg;
  local_90 = pSVar16;
  local_88 = sccAtoms;
  if (uVar20 == 0) {
    uVar15 = 0;
  }
  else {
    uVar22 = 0;
    uVar15 = 0;
    local_48 = uVar20;
    do {
      pPVar10 = local_a0;
      pPVar2 = (sccAtoms->ebo_).buf[uVar22];
      PVar3 = (pPVar2->super_PrgHead).super_PrgNode;
      iVar13 = PVar3._0_4_;
      if ((((-1 < iVar13) && (((ulong)PVar3 & 0x4000000000000000) == 0)) &&
          (uVar19 = *(uint *)&(pPVar2->super_PrgHead).field_0x18, sccAtoms = local_88,
          (uVar19 & 0x8000000) != 0)) &&
         ((uVar19 = uVar19 & 0x7ffffff, uVar19 != 0x7ffffff &&
          ((byte)(*(byte *)((long)((*(pSVar16->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf +
                           (ulong)(iVar13 * 2 & 0xfffffffc)) & 3) != (byte)(2 - (PVar3._0_1_ & 1))))
         )) {
        uVar21 = (local_a0->atoms_).ebo_.size;
        local_78.super_Node._0_8_ = (pointer)0x7ffffff00000000;
        local_78.super_Node.adj_ = (NodeId *)0x0;
        local_78.super_Node.sep_ = (NodeId *)0x0;
        local_80 = (BodyVec *)CONCAT44(local_80._4_4_,uVar15);
        bk_lib::
        pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
        ::push_back(&local_a0->atoms_,&local_78);
        pSVar16 = local_90;
        pAVar4 = (pPVar10->atoms_).ebo_.buf;
        uVar15 = (pPVar10->atoms_).ebo_.size - 1;
        pAVar4[uVar15].super_Node.lit.rep_ = iVar13 * 2;
        *(uint *)&pAVar4[uVar15].super_Node.field_0x4 =
             *(uint *)&pAVar4[uVar15].super_Node.field_0x4 & 0xf0000000 | uVar19;
        PVar3 = (pPVar2->super_PrgHead).super_PrgNode;
        (pPVar2->super_PrgHead).super_PrgNode =
             (PrgNode)((ulong)PVar3 & 0x30000000ffffffff | (ulong)(uVar21 & 0xfffffff) << 0x20 |
                      0x8000000000000000);
        SharedContext::setFrozen(local_90,(uint)((ulong)PVar3 >> 1) & 0x3fffffff,true);
        uVar15 = (int)local_80 + (pPVar2->super_PrgHead).supports_.ebo_.size;
        uVar20 = local_48;
        sccAtoms = local_88;
      }
      uVar22 = uVar22 + 1;
    } while (uVar20 != uVar22);
    uVar15 = uVar15 >> 1;
  }
  pLVar24 = local_98;
  local_78.super_Node._0_8_ = (pointer)0x0;
  local_78.super_Node.adj_ = (NodeId *)0x0;
  local_58.ebo_.buf = (uint *)0x0;
  local_58.ebo_.size = 0;
  local_58.ebo_.cap = 0;
  local_80 = &local_a0->bodies_;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
  ::reserve(local_80,uVar15 + (local_a0->bodies_).ebo_.size);
  local_48 = (ulong)(sccAtoms->ebo_).size;
  if (local_48 != 0) {
    uVar20 = 0;
    do {
      pPVar2 = (sccAtoms->ebo_).buf[uVar20];
      PVar3 = (pPVar2->super_PrgHead).super_PrgNode;
      if (((-1 < PVar3._0_4_) && (((ulong)PVar3 & 0x4000000000000000) == 0)) &&
         ((uVar15 = *(uint *)&(pPVar2->super_PrgHead).field_0x18, (uVar15 & 0x8000000) != 0 &&
          (((uVar15 & 0x7ffffff) != 0x7ffffff &&
           ((byte)(*(byte *)((long)((*(local_90->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf +
                            (ulong)(PVar3._0_4_ * 2 & 0xfffffffc)) & 3) !=
            (byte)(2 - (PVar3._0_1_ & 1)))))))) {
        uVar22 = (ulong)(pPVar2->super_PrgHead).supports_.ebo_.size;
        if (uVar22 == 0) {
          uVar15 = 0;
        }
        else {
          pPVar5 = (pPVar2->super_PrgHead).supports_.ebo_.buf;
          lVar17 = 0;
          uVar15 = 0;
          do {
            local_a8.first_._0_4_ = 0xfffffff;
            uVar19 = *(uint *)((long)&pPVar5->rep + lVar17);
            if ((uVar19 & 0xc) == 8) {
              uVar19 = addDisj(local_a0,local_98,(local_98->disjunctions_).ebo_.buf[uVar19 >> 4]);
              local_a8.first_._0_4_ = uVar19;
              uVar15 = uVar15 | 2;
LAB_00131d39:
              if (uVar19 != 0xfffffff) {
                pBVar7 = (local_80->ebo_).buf;
                uVar21 = *(uint *)&pBVar7[uVar19].super_Node.field_0x4;
                if (-1 < (int)uVar21) {
                  *(uint *)&pBVar7[uVar19].super_Node.field_0x4 = uVar21 | 0x80000000;
                  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                             (uint *)&local_a8);
                }
                uVar15 = uVar15 | *(uint *)((long)&pPVar5->rep + lVar17) >> 1 & 1;
              }
            }
            else if (((uVar19 & 0xc) == 4) && ((uVar19 & 1) == 0)) {
              pPVar6 = (local_98->bodies_).ebo_.buf[uVar19 >> 4];
              PVar3 = pPVar6->super_PrgNode;
              uVar19 = 0xfffffff;
              if ((byte)(*(byte *)((long)((*(local_90->solvers_).ebo_.buf)->assign_).assign_.ebo_.
                                         buf + (ulong)(PVar3._0_4_ * 2 & 0xfffffffc)) & 3) !=
                  (byte)(2 - (PVar3._0_1_ & 1))) {
                uVar19 = addBody(local_a0,local_98,pPVar6);
              }
              local_a8.first_._0_4_ = uVar19;
              goto LAB_00131d39;
            }
            lVar17 = lVar17 + 4;
          } while (uVar22 << 2 != lVar17);
        }
        local_40 = (uint32)local_78.super_Node.adj_;
        uVar22 = (ulong)(pPVar2->deps_).ebo_.size;
        if (uVar22 != 0) {
          pLVar23 = (pPVar2->deps_).ebo_.buf;
          pLVar1 = pLVar23 + uVar22;
          do {
            if ((((pLVar23->rep_ & 2) == 0) &&
                (pPVar6 = (local_98->bodies_).ebo_.buf[pLVar23->rep_ >> 2],
                (byte)(*(byte *)((long)((*(local_90->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf
                                + (ulong)(SUB84(pPVar6->super_PrgNode,0) * 2 & 0xfffffffc)) & 3) !=
                (byte)(2 - (SUB81(pPVar6->super_PrgNode,0) & 1)))) &&
               (uVar12 = PrgBody::scc(pPVar6,local_98),
               uVar12 == (*(uint *)&(pPVar2->super_PrgHead).field_0x18 & 0x7ffffff))) {
              uVar12 = addBody(local_a0,local_98,pPVar6);
              local_a8.first_._0_4_ = uVar12;
              if (((local_80->ebo_).buf[uVar12].super_Node.field_0x7 & 0x10) == 0) {
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                           (uint *)&local_a8);
              }
              else {
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&local_58,(uint *)&local_a8);
                pBVar7 = (local_80->ebo_).buf;
                puVar18 = pBVar7[(ulong)local_a8.first_ & 0xffffffff].super_Node.sep_;
                bVar25 = *puVar18 == 0xffffffff;
                local_3c = 0;
                if ((!bVar25) &&
                   (uVar19 = *(uint *)&(pPVar2->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff,
                   local_3c = 0, *puVar18 != uVar19)) {
                  local_3c = 0;
                  do {
                    puVar18 = puVar18 + (2 - (ulong)((pBVar7[(ulong)local_a8.first_ & 0xffffffff].
                                                      super_Node.field_0x7 & 0x20) == 0));
                    local_3c = local_3c + 1;
                    bVar25 = *puVar18 == 0xffffffff;
                    if (bVar25) break;
                  } while (*puVar18 != uVar19);
                }
                if (bVar25) {
                  local_3c = 0xffffffff;
                }
                bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&local_58,&local_3c);
                uVar15 = uVar15 | 4;
              }
            }
            pLVar23 = pLVar23 + 1;
          } while (pLVar23 != pLVar1);
        }
        sccAtoms = local_88;
        pLVar24 = local_98;
        if (local_58.ebo_.size != 0) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                     &Potassco::idMax);
          local_a8.first_ = local_58.ebo_.buf;
          bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>::
          insert_impl<unsigned_int,bk_lib::detail::Memcpy<unsigned_int>>
                    ((pod_vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                     (iterator)
                     (local_78.super_Node._0_8_ + ((ulong)local_78.super_Node.adj_ & 0xffffffff) * 4
                     ),local_58.ebo_.size,&local_a8);
        }
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   &Potassco::idMax);
        initAtom(local_a0,*(uint *)&(pPVar2->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff,
                 uVar15,(pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                 local_40);
        local_78.super_Node.adj_ = (NodeId *)((ulong)local_78.super_Node.adj_ & 0xffffffff00000000);
        local_58.ebo_._8_8_ = local_58.ebo_._8_8_ & 0xffffffff00000000;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_48);
  }
  pNVar11 = local_38;
  pPVar10 = local_a0;
  if ((((local_38->super_type).ebo_.size != 0) && (local_a0->stats_ == (NonHcfStats *)0x0)) &&
     ((local_38->config != (Configuration *)0x0 &&
      (iVar13 = (*local_38->config->_vptr_Configuration[3])(),
      (*(byte *)(CONCAT44(extraout_var,iVar13) + 8) & 0x18) != 0)))) {
    iVar13 = (*pNVar11->config->_vptr_Configuration[3])();
    pNVar14 = enableNonHcfStats(pPVar10,*(uint *)(CONCAT44(extraout_var_00,iVar13) + 8) >> 3 & 3,
                                pLVar24->incData_ != (Incremental *)0x0);
    pPVar10->stats_ = pNVar14;
  }
  uVar20 = (ulong)(pPVar10->components_).ebo_.size;
  if (uVar20 != 0) {
    ppNVar8 = (pPVar10->components_).ebo_.buf;
    lVar17 = 0;
    do {
      NonHcfComponent::update(*(NonHcfComponent **)((long)ppNVar8 + lVar17),local_90);
      lVar17 = lVar17 + 8;
    } while (uVar20 << 3 != lVar17);
  }
  uVar15 = *(uint *)&pPVar10->field_0x38;
  uVar21 = uVar15 & 0x7fffffff;
  uVar20 = (ulong)uVar21;
  uVar19 = (pNVar11->super_type).ebo_.size;
  if (uVar21 != uVar19) {
    puVar9 = (pNVar11->super_type).ebo_.buf;
    lVar17 = (ulong)uVar19 * 4 + uVar20 * -4;
    do {
      addNonHcf(pPVar10,(uint32)uVar20,local_90,pNVar11->config,puVar9[uVar20]);
      uVar20 = uVar20 + 1;
      lVar17 = lVar17 + -4;
    } while (lVar17 != 0);
    uVar15 = *(uint *)&pPVar10->field_0x38;
    uVar21 = (pNVar11->super_type).ebo_.size & 0x7fffffff;
  }
  *(uint *)&pPVar10->field_0x38 = uVar15 & 0x80000000 | uVar21;
  if (local_58.ebo_.buf != (uint *)0x0) {
    operator_delete(local_58.ebo_.buf);
  }
  if ((pointer)local_78.super_Node._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78.super_Node._0_8_);
  }
  return;
}

Assistant:

void PrgDepGraph::addSccs(LogicProgram& prg, const AtomList& sccAtoms, const NonHcfSet& nonHcfs) {
	// Pass 1: Create graph atom nodes and estimate number of bodies
	atoms_.reserve(atoms_.size() + sccAtoms.size());
	AtomList::size_type numBodies = 0;
	SharedContext& ctx = *prg.ctx();
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom* a = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			// add graph atom node and store link between program node and graph node for later lookup
			a->resetId(createAtom(a->literal(), a->scc()), true);
			// atom is defined by more than just a bunch of clauses
			ctx.setFrozen(a->var(), true);
			numBodies += a->supports();
		}
	}
	// Pass 2: Init atom nodes and create body nodes
	VarVec adj, ext;
	bodies_.reserve(bodies_.size() + numBodies/2);
	PrgBody* prgBody; PrgDisj* prgDis;
	for (AtomList::size_type i = 0, end = sccAtoms.size(); i != end; ++i) {
		PrgAtom*   a  = sccAtoms[i];
		if (relevantPrgAtom(*ctx.master(), a)) {
			uint32 prop = 0;
			for (PrgAtom::sup_iterator it = a->supps_begin(), endIt = a->supps_end(); it != endIt; ++it) {
				assert(it->isBody() || it->isDisj());
				NodeId bId= PrgNode::noNode;
				if (it->isBody() && !it->isGamma()) {
					prgBody = prg.getBody(it->node());
					bId     = relevantPrgBody(*ctx.master(), prgBody) ? addBody(prg, prgBody) : PrgNode::noNode;
				}
				else if (it->isDisj()) {
					prgDis  = prg.getDisj(it->node());
					bId     = addDisj(prg, prgDis);
					prop   |= AtomNode::property_in_disj;
				}
				if (bId != PrgNode::noNode) {
					if (!bodies_[bId].seen()) {
						bodies_[bId].seen(true);
						adj.push_back(bId);
					}
					if (it->isChoice()) {
						// mark atom as in choice
						prop |= AtomNode::property_in_choice;
					}
				}
			}
			uint32 nPred= (uint32)adj.size();
			for (PrgAtom::dep_iterator it = a->deps_begin(), endIt = a->deps_end(); it != endIt; ++it) {
				if (!it->sign()) {
					prgBody = prg.getBody(it->var());
					if (relevantPrgBody(*ctx.master(), prgBody) && prgBody->scc(prg) == a->scc()) {
						NodeId bodyId = addBody(prg, prgBody);
						if (!bodies_[bodyId].extended()) {
							adj.push_back(bodyId);
						}
						else {
							ext.push_back(bodyId);
							ext.push_back(bodies_[bodyId].get_pred_idx(a->id()));
							assert(bodies_[bodyId].get_pred(ext.back()) == a->id());
							prop |= AtomNode::property_in_ext;
						}
					}
				}
			}
			if (!ext.empty()) {
				adj.push_back(idMax);
				adj.insert(adj.end(), ext.begin(), ext.end());
			}
			adj.push_back(idMax);
			initAtom(a->id(), prop, adj, nPred);
			adj.clear(); ext.clear();
		}
	}
	if (nonHcfs.size() != 0 && stats_ == 0 && nonHcfs.config && nonHcfs.config->context().stats) {
		stats_ = enableNonHcfStats(nonHcfs.config->context().stats, prg.isIncremental());
	}
	// "update" existing non-hcf components
	for (NonHcfIter it = nonHcfBegin(), end = nonHcfEnd(); it != end; ++it) {
		(*it)->update(ctx);
	}
	// add new non-hcf components
	uint32 hcc = seenComponents_;
	for (NonHcfSet::const_iterator it = nonHcfs.begin() + seenComponents_, end = nonHcfs.end(); it != end; ++it, ++hcc) {
		addNonHcf(hcc, ctx, nonHcfs.config, *it);
	}
	seenComponents_ = nonHcfs.size();
}